

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O1

uint64_t benchmark_index(int files,int file_size)

{
  TaskSpec *spec;
  long *plVar1;
  long lVar2;
  long lVar3;
  string *dsname;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer ppOVar5;
  initializer_list<IndexType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<IndexType,_std::allocator<IndexType>_> index_types;
  path ursa_file;
  Task task;
  set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
  working_snapshots;
  path test_path;
  Database db;
  allocator_type local_3f1;
  vector<IndexType,_std::allocator<IndexType>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [8];
  _Rb_tree_node_base _Stack_3b0;
  size_t sStack_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380;
  path local_368;
  Task local_328;
  undefined1 local_308 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  pointer local_2e8;
  pointer local_2e0;
  path local_2c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  local_288;
  value_t local_258;
  json_value local_250 [8];
  pointer local_248;
  pointer local_238;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1d0;
  path local_198;
  undefined1 local_158 [248];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_60;
  
  produce_test_files_abi_cxx11_(&local_198,files,file_size);
  std::experimental::filesystem::v1::temp_directory_path_abi_cxx11_((v1 *)&local_368);
  random_hex_string_abi_cxx11_((string *)local_158,8);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_158,0,(char *)0x0,0x198040);
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 == paVar4) {
    local_2f8._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_2f8._8_8_ = plVar1[3];
    local_308._0_8_ = &local_2f8;
  }
  else {
    local_2f8._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_308._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar1;
  }
  local_308._8_8_ = plVar1[1];
  *plVar1 = (long)paVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::experimental::filesystem::v1::__cxx11::path::append<std::__cxx11::string>
            (&local_368,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._0_8_ != &local_2f8) {
    operator_delete((void *)local_308._0_8_,local_2f8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  local_308._0_8_ = &local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,local_368._M_pathname._M_dataplus._M_p,
             local_368._M_pathname._M_dataplus._M_p + local_368._M_pathname._M_string_length);
  Database::create((string *)local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._0_8_ != &local_2f8) {
    operator_delete((void *)local_308._0_8_,local_2f8._M_allocated_capacity + 1);
  }
  local_308._0_8_ = &local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,local_368._M_pathname._M_dataplus._M_p,
             local_368._M_pathname._M_dataplus._M_p + local_368._M_pathname._M_string_length);
  Database::Database((Database *)local_158,(string *)local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._0_8_ != &local_2f8) {
    operator_delete((void *)local_308._0_8_,local_2f8._M_allocated_capacity + 1);
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  Database::snapshot((DatabaseSnapshot *)local_308,(Database *)local_158);
  local_3b8._0_4_ = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)local_3b8;
  std::vector<IndexType,_std::allocator<IndexType>_>::vector
            (&local_3f0,__l,(allocator_type *)&local_328);
  local_328.spec_ = Database::allocate_task((Database *)local_158);
  local_328.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_3b0._M_left = &_Stack_3b0;
  _Stack_3b0._M_parent = (_Base_ptr)0x0;
  local_3b8 = (undefined1  [8])0x0;
  _Stack_3b0._0_8_ = (pointer)0x0;
  sStack_390 = 0;
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  _Stack_3b0._M_right = _Stack_3b0._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,local_198._M_pathname._M_dataplus._M_p,
             local_198._M_pathname._M_dataplus._M_p + local_198._M_pathname._M_string_length);
  __l_00._M_len = 1;
  __l_00._M_array = &local_3d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_380,__l_00,&local_3f1);
  DatabaseSnapshot::recursive_index_paths
            ((DatabaseSnapshot *)local_308,&local_328,&local_3f0,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3b8,&local_380);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3b8);
  spec = local_328.spec_;
  std::vector<DBChange,_std::allocator<DBChange>_>::vector
            ((vector<DBChange,_std::allocator<DBChange>_> *)local_3b8,&local_328.changes_);
  Database::commit_task
            ((Database *)local_158,spec,(vector<DBChange,_std::allocator<DBChange>_> *)local_3b8);
  std::vector<DBChange,_std::allocator<DBChange>_>::~vector
            ((vector<DBChange,_std::allocator<DBChange>_> *)local_3b8);
  std::vector<DBChange,_std::allocator<DBChange>_>::~vector(&local_328.changes_);
  if (local_3f0.super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f0.super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f0.super__Vector_base<IndexType,_std::allocator<IndexType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f0.super__Vector_base<IndexType,_std::allocator<IndexType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_200);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_230);
  if (local_248 != (pointer)0x0) {
    operator_delete(local_248,(long)local_238 - (long)local_248);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy(local_250,local_258);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::~_Rb_tree(&local_288);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2c8);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_308);
  lVar3 = std::chrono::_V2::steady_clock::now();
  if (local_158._176_8_ != local_158._184_8_) {
    ppOVar5 = (pointer)local_158._176_8_;
    do {
      dsname = OnDiskDataset::get_name_abi_cxx11_(*ppOVar5);
      Database::drop_dataset((Database *)local_158,dsname);
      ppOVar5 = ppOVar5 + 1;
    } while (ppOVar5 != (pointer)local_158._184_8_);
  }
  local_2f8._8_8_ = local_308 + 8;
  local_308._8_8_ = local_308._8_8_ & 0xffffffff00000000;
  local_2f8._M_allocated_capacity = 0;
  local_2e0 = (pointer)0x0;
  local_2e8 = (pointer)local_2f8._8_8_;
  Database::collect_garbage
            ((Database *)local_158,
             (set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
              *)local_308);
  std::experimental::filesystem::v1::remove_all(&local_198);
  std::
  _Rb_tree<DatabaseSnapshot_*,_DatabaseSnapshot_*,_std::_Identity<DatabaseSnapshot_*>,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
  ::~_Rb_tree((_Rb_tree<DatabaseSnapshot_*,_DatabaseSnapshot_*,_std::_Identity<DatabaseSnapshot_*>,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
               *)local_308);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_158 + 0xe8),local_158[0xe0]);
  std::
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ::~vector((vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
             *)(local_158 + 200));
  if ((pointer)local_158._176_8_ != (pointer)0x0) {
    operator_delete((void *)local_158._176_8_,local_158._192_8_ - local_158._176_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
               *)(local_158 + 0x80));
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)(local_158 + 0x40));
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_158);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_368);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_198);
  return (lVar3 - lVar2) / 1000000;
}

Assistant:

uint64_t benchmark_index(int files, int file_size) {
    fs::path test_path = produce_test_files(files, file_size);

    fs::path ursa_file = fs::temp_directory_path();
    ursa_file /= "ursabench_" + random_hex_string(8);

    Database::create(ursa_file);
    Database db(ursa_file);
    uint64_t result = benchmark_ms([&db, &test_path]() {
        auto snap = db.snapshot();
        std::vector<IndexType> index_types = {IndexType::GRAM3};
        Task task = Task(db.allocate_task());
        snap.recursive_index_paths(&task, index_types, {}, {test_path});
        db.commit_task(task.spec(), task.changes());
    });
    for (auto ds : db.working_sets()) {
        db.drop_dataset(ds->get_name());
    }
    std::set<DatabaseSnapshot *> working_snapshots;
    db.collect_garbage(working_snapshots);
    fs::remove_all(test_path);
    return result;
}